

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O3

void sx_dump_leaks(sx_dump_leak_cb dump_leak_fn)

{
  stb__leakcheck_malloc_info **ppsVar1;
  uint uVar2;
  size_t sVar3;
  stb__leakcheck_malloc_info *psVar4;
  char local_238 [520];
  
  psVar4 = mi_head;
  if (mi_head != (stb__leakcheck_malloc_info *)0x0) {
    do {
      sVar3 = psVar4->size;
      if (-1 < (long)sVar3) {
        uVar2 = psVar4->line;
        sx_snprintf(local_238,0x200,"%-6s: %s@%d: %s: %$.2d at 0x%p","LEAKED",psVar4,(ulong)uVar2,
                    psVar4->func,sVar3,psVar4 + 1);
        if (dump_leak_fn == (sx_dump_leak_cb)0x0) {
          puts(local_238);
        }
        else {
          (*dump_leak_fn)(local_238,psVar4->file,psVar4->func,uVar2,sVar3,psVar4 + 1);
        }
      }
      ppsVar1 = &psVar4->next;
      psVar4 = *ppsVar1;
    } while (*ppsVar1 != (stb__leakcheck_malloc_info *)0x0);
  }
  return;
}

Assistant:

void sx_dump_leaks(sx_dump_leak_cb dump_leak_fn)
{
    stb__leakcheck_malloc_info* mi = mi_head;
    while (mi) {
        if ((ptrdiff_t)mi->size >= 0) {
            stblkck_internal_print(dump_leak_fn, "LEAKED", mi->file, mi->func, mi->line, mi->size, mi + 1);
        }
        mi = mi->next;
    }
}